

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecdsa_end_to_end(void)

{
  char cVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  bool bVar6;
  secp256k1_pubkey pubkey2_1;
  uchar rnd_1 [32];
  int ret2_1;
  int ret1_1;
  secp256k1_pubkey pubkey2;
  uchar rnd [32];
  int ret2;
  int ret1;
  secp256k1_scalar key;
  secp256k1_scalar msg;
  size_t seckeylen;
  uchar seckey [300];
  secp256k1_pubkey pubkey_tmp;
  secp256k1_pubkey pubkey;
  size_t pubkeyclen;
  uchar pubkeyc [65];
  size_t siglen;
  uchar sig [74];
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_ecdsa_signature signature [6];
  uchar privkey2 [32];
  uchar message [32];
  uchar privkey [32];
  uchar extra [32];
  undefined4 in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  uchar *in_stack_fffffffffffffa10;
  secp256k1_context *psVar7;
  secp256k1_scalar *a;
  secp256k1_scalar *r_00;
  secp256k1_context *privkey_00;
  secp256k1_scalar *in_stack_fffffffffffffa30;
  uchar *out32;
  secp256k1_context *in_stack_fffffffffffffa38;
  secp256k1_ecdsa_signature *in_stack_fffffffffffffa40;
  secp256k1_ecdsa_signature *in_stack_fffffffffffffa48;
  secp256k1_ecdsa_signature *in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa58;
  int in_stack_fffffffffffffa5c;
  uchar *in_stack_fffffffffffffa60;
  secp256k1_context *in_stack_fffffffffffffa68;
  secp256k1_pubkey *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  uint in_stack_fffffffffffffa7c;
  secp256k1_ecdsa_signature *in_stack_fffffffffffffa80;
  secp256k1_context *in_stack_fffffffffffffa88;
  uchar *in_stack_fffffffffffffa90;
  secp256k1_context *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  secp256k1_context *in_stack_fffffffffffffaa8;
  secp256k1_pubkey *in_stack_fffffffffffffad0;
  uchar *in_stack_fffffffffffffad8;
  secp256k1_ecdsa_signature *in_stack_fffffffffffffae0;
  secp256k1_context *in_stack_fffffffffffffae8;
  secp256k1_scalar local_4a8 [9];
  undefined1 local_370 [64];
  undefined1 local_330 [64];
  undefined8 local_2f0;
  uchar local_2e8 [72];
  undefined8 local_2a0;
  char local_298 [80];
  secp256k1_scalar local_248;
  secp256k1_scalar local_228;
  secp256k1_ecdsa_signature local_208;
  undefined1 auStack_1c8 [64];
  undefined1 auStack_188 [64];
  undefined1 auStack_148 [64];
  undefined1 auStack_108 [64];
  secp256k1_ecdsa_signature sStack_c8;
  undefined1 local_88 [64];
  secp256k1_scalar local_48;
  undefined1 local_28 [31];
  undefined1 local_9;
  
  memset(local_28,0,0x20);
  local_2a0 = 0x4a;
  local_2f0 = 0x41;
  testutil_random_scalar_order_test(in_stack_fffffffffffffa30);
  testutil_random_scalar_order_test(in_stack_fffffffffffffa30);
  secp256k1_scalar_get_b32
            (in_stack_fffffffffffffa10,
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  secp256k1_scalar_get_b32
            (in_stack_fffffffffffffa10,
             (secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
  iVar2 = secp256k1_ec_seckey_verify(in_stack_fffffffffffffa38,(uchar *)in_stack_fffffffffffffa30);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1902,"test condition failed: secp256k1_ec_seckey_verify(CTX, privkey) == 1");
    abort();
  }
  iVar2 = secp256k1_ec_pubkey_create
                    (in_stack_fffffffffffffaa8,
                     (secp256k1_pubkey *)
                     CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                     (uchar *)in_stack_fffffffffffffa98);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1903,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, privkey) == 1")
    ;
    abort();
  }
  out32 = local_2e8;
  privkey_00 = CTX;
  testrand_bits(in_stack_fffffffffffffa0c);
  iVar2 = secp256k1_ec_pubkey_serialize
                    (in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                     (size_t *)in_stack_fffffffffffffa88,
                     (secp256k1_pubkey *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa7c);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1906,
            "test condition failed: secp256k1_ec_pubkey_serialize(CTX, pubkeyc, &pubkeyclen, &pubkey, testrand_bits(1) == 1 ? SECP256K1_EC_COMPRESSED : SECP256K1_EC_UNCOMPRESSED)"
           );
    abort();
  }
  memset(local_330,0,0x40);
  iVar2 = secp256k1_ec_pubkey_parse
                    (in_stack_fffffffffffffa88,(secp256k1_pubkey *)in_stack_fffffffffffffa80,
                     (uchar *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     (size_t)in_stack_fffffffffffffa70);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1908,
            "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1"
           );
    abort();
  }
  memcpy(local_370,local_330,0x40);
  iVar2 = secp256k1_ec_pubkey_negate
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     in_stack_fffffffffffffa70);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x190c,"test condition failed: secp256k1_ec_pubkey_negate(CTX, &pubkey_tmp) == 1");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_370,local_330,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x190d,
            "test condition failed: secp256k1_memcmp_var(&pubkey_tmp, &pubkey, sizeof(pubkey)) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_ec_pubkey_negate
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     in_stack_fffffffffffffa70);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x190e,"test condition failed: secp256k1_ec_pubkey_negate(CTX, &pubkey_tmp) == 1");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(local_370,local_330,0x40);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x190f,
            "test condition failed: secp256k1_memcmp_var(&pubkey_tmp, &pubkey, sizeof(pubkey)) == 0"
           );
    abort();
  }
  a = local_4a8;
  r_00 = &local_48;
  psVar7 = CTX;
  testrand_bits(in_stack_fffffffffffffa0c);
  uVar5 = (uint32_t)((ulong)psVar7 >> 0x20);
  iVar2 = ec_privkey_export_der
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     in_stack_fffffffffffffa70->data,(size_t *)in_stack_fffffffffffffa68,
                     in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1912,
            "test condition failed: ec_privkey_export_der(CTX, seckey, &seckeylen, privkey, testrand_bits(1) == 1)"
           );
    abort();
  }
  iVar2 = ec_privkey_import_der(in_stack_fffffffffffffa38,out32,(uchar *)privkey_00,(size_t)r_00);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1913,
            "test condition failed: ec_privkey_import_der(CTX, privkey2, seckey, seckeylen) == 1");
    abort();
  }
  iVar2 = secp256k1_memcmp_var(&local_48,local_88,0x20);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1914,"test condition failed: secp256k1_memcmp_var(privkey, privkey2, 32) == 0");
    abort();
  }
  uVar3 = testrand_int(uVar5);
  if (uVar3 == 0) {
    testrand256_test((uchar *)0x155f33);
    iVar2 = secp256k1_ec_seckey_tweak_add(in_stack_fffffffffffffa38,out32,(uchar *)privkey_00);
    iVar4 = secp256k1_ec_pubkey_tweak_add
                      (in_stack_fffffffffffffa88,(secp256k1_pubkey *)in_stack_fffffffffffffa80,
                       (uchar *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78));
    if (iVar2 != iVar4) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x191f,"test condition failed: ret1 == ret2");
      abort();
    }
    if (iVar2 == 0) {
      return;
    }
    iVar2 = secp256k1_ec_pubkey_create
                      (in_stack_fffffffffffffaa8,
                       (secp256k1_pubkey *)
                       CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                       (uchar *)in_stack_fffffffffffffa98);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1923,
              "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey2, privkey) == 1");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_330,&stack0xfffffffffffffaa8,0x40);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1924,
              "test condition failed: secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0")
      ;
      abort();
    }
  }
  uVar3 = testrand_int(uVar5);
  if (uVar3 == 0) {
    testrand256_test((uchar *)0x1560c7);
    iVar2 = secp256k1_ec_seckey_tweak_mul
                      (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                       (uchar *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58));
    iVar4 = secp256k1_ec_pubkey_tweak_mul
                      (in_stack_fffffffffffffaa8,
                       (secp256k1_pubkey *)CONCAT44(iVar2,in_stack_fffffffffffffaa0),
                       (uchar *)in_stack_fffffffffffffa98);
    if (iVar2 != iVar4) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1930,"test condition failed: ret1 == ret2");
      abort();
    }
    if (iVar2 == 0) {
      return;
    }
    iVar2 = secp256k1_ec_pubkey_create
                      (in_stack_fffffffffffffaa8,(secp256k1_pubkey *)CONCAT44(iVar2,iVar4),
                       (uchar *)in_stack_fffffffffffffa98);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1934,
              "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey2, privkey) == 1");
      abort();
    }
    iVar2 = secp256k1_memcmp_var(local_330,&stack0xfffffffffffffa38,0x40);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1935,
              "test condition failed: secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0")
      ;
      abort();
    }
  }
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                     (uchar *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     in_stack_fffffffffffffa70->data,
                     (secp256k1_nonce_function)in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1939,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[0], message, privkey, NULL, NULL) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                     (uchar *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     in_stack_fffffffffffffa70->data,
                     (secp256k1_nonce_function)in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x193a,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[4], message, privkey, NULL, NULL) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                     (uchar *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     in_stack_fffffffffffffa70->data,
                     (secp256k1_nonce_function)in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x193b,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[1], message, privkey, NULL, extra) == 1"
           );
    abort();
  }
  local_9 = 1;
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                     (uchar *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     in_stack_fffffffffffffa70->data,
                     (secp256k1_nonce_function)in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x193d,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[2], message, privkey, NULL, extra) == 1"
           );
    abort();
  }
  local_9 = 0;
  local_28[0] = 1;
  iVar2 = secp256k1_ecdsa_sign
                    (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                     (uchar *)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     in_stack_fffffffffffffa70->data,
                     (secp256k1_nonce_function)in_stack_fffffffffffffa68,in_stack_fffffffffffffa60);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1940,
            "test condition failed: secp256k1_ecdsa_sign(CTX, &signature[3], message, privkey, NULL, extra) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(&local_208,auStack_108,0x40);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1941,
            "test condition failed: secp256k1_memcmp_var(&signature[0], &signature[4], sizeof(signature[0])) == 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(&local_208,auStack_1c8,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1942,
            "test condition failed: secp256k1_memcmp_var(&signature[0], &signature[1], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(&local_208,auStack_188,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1943,
            "test condition failed: secp256k1_memcmp_var(&signature[0], &signature[2], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(&local_208,auStack_148,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1944,
            "test condition failed: secp256k1_memcmp_var(&signature[0], &signature[3], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(auStack_1c8,auStack_188,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1945,
            "test condition failed: secp256k1_memcmp_var(&signature[1], &signature[2], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(auStack_1c8,auStack_148,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1946,
            "test condition failed: secp256k1_memcmp_var(&signature[1], &signature[3], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_memcmp_var(auStack_188,auStack_148,0x40);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1947,
            "test condition failed: secp256k1_memcmp_var(&signature[2], &signature[3], sizeof(signature[0])) != 0"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                     in_stack_fffffffffffffad0);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1949,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                     in_stack_fffffffffffffad0);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x194a,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[1], message, &pubkey) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                     in_stack_fffffffffffffad0);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x194b,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[2], message, &pubkey) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                     in_stack_fffffffffffffad0);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x194c,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[3], message, &pubkey) == 1"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_signature_normalize
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                     in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x194e,
            "test condition failed: !secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[0])")
    ;
    abort();
  }
  secp256k1_ecdsa_signature_load(CTX,&local_228,&local_248,&local_208);
  secp256k1_scalar_negate(r_00,a);
  secp256k1_ecdsa_signature_save(&sStack_c8,&local_228,&local_248);
  iVar2 = secp256k1_ecdsa_verify
                    (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                     in_stack_fffffffffffffad0);
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1952,
            "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 0"
           );
    abort();
  }
  iVar2 = secp256k1_ecdsa_signature_normalize
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                     in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1953,
            "test condition failed: secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5])");
    abort();
  }
  iVar2 = secp256k1_ecdsa_signature_normalize
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                     in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  if (iVar2 != 0) {
    iVar2 = secp256k1_ecdsa_signature_normalize
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                       in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1955,
              "test condition failed: !secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5])"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_signature_normalize
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                       in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1956,
              "test condition failed: !secp256k1_ecdsa_signature_normalize(CTX, &signature[5], &signature[5])"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_verify
                      (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8
                       ,in_stack_fffffffffffffad0);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1957,
              "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 1"
             );
      abort();
    }
    secp256k1_scalar_negate(r_00,a);
    secp256k1_ecdsa_signature_save(&sStack_c8,&local_228,&local_248);
    iVar2 = secp256k1_ecdsa_signature_normalize
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                       in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x195a,
              "test condition failed: !secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5])"
             );
      abort();
    }
    iVar2 = secp256k1_ecdsa_verify
                      (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8
                       ,in_stack_fffffffffffffad0);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x195b,
              "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 1"
             );
      abort();
    }
    iVar2 = secp256k1_memcmp_var(&sStack_c8,&local_208,0x40);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x195c,
              "test condition failed: secp256k1_memcmp_var(&signature[5], &signature[0], 64) == 0");
      abort();
    }
    iVar2 = secp256k1_ecdsa_signature_serialize_der
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                       in_stack_fffffffffffffa50->data,(size_t *)in_stack_fffffffffffffa48,
                       in_stack_fffffffffffffa40);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x195f,
              "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, sig, &siglen, &signature[0]) == 1"
             );
      abort();
    }
    memset(&local_208,0,0x40);
    iVar2 = secp256k1_ecdsa_signature_parse_der
                      ((secp256k1_context *)
                       CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                       in_stack_fffffffffffffa50,in_stack_fffffffffffffa48->data,
                       (size_t)in_stack_fffffffffffffa40);
    if (iVar2 == 1) {
      iVar2 = secp256k1_ecdsa_verify
                        (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                         in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                ,0x1962,
                "test condition failed: secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 1"
               );
        abort();
      }
      local_2a0 = 0x4a;
      iVar2 = secp256k1_ecdsa_signature_serialize_der
                        ((secp256k1_context *)
                         CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                         in_stack_fffffffffffffa50->data,(size_t *)in_stack_fffffffffffffa48,
                         in_stack_fffffffffffffa40);
      if (iVar2 == 1) {
        uVar3 = testrand_int(uVar5);
        cVar1 = (char)uVar3 + '\x01';
        uVar5 = testrand_int(uVar5);
        local_298[uVar5] = local_298[uVar5] + cVar1;
        iVar2 = secp256k1_ecdsa_signature_parse_der
                          ((secp256k1_context *)
                           CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                           in_stack_fffffffffffffa50,in_stack_fffffffffffffa48->data,
                           (size_t)in_stack_fffffffffffffa40);
        bVar6 = true;
        if (iVar2 != 0) {
          iVar2 = secp256k1_ecdsa_verify
                            (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                             in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
          bVar6 = iVar2 == 0;
        }
        if (bVar6) {
          return;
        }
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
                ,0x1968,
                "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &signature[0], sig, siglen) == 0 || secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 0"
               );
        abort();
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
              ,0x1965,
              "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, sig, &siglen, &signature[0]) == 1"
             );
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c"
            ,0x1961,
            "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &signature[0], sig, siglen) == 1"
           );
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c",
          0x1954,
          "test condition failed: secp256k1_ecdsa_signature_normalize(CTX, &signature[5], &signature[5])"
         );
  abort();
}

Assistant:

static void test_ecdsa_end_to_end(void) {
    unsigned char extra[32] = {0x00};
    unsigned char privkey[32];
    unsigned char message[32];
    unsigned char privkey2[32];
    secp256k1_ecdsa_signature signature[6];
    secp256k1_scalar r, s;
    unsigned char sig[74];
    size_t siglen = 74;
    unsigned char pubkeyc[65];
    size_t pubkeyclen = 65;
    secp256k1_pubkey pubkey;
    secp256k1_pubkey pubkey_tmp;
    unsigned char seckey[300];
    size_t seckeylen = 300;

    /* Generate a random key and message. */
    {
        secp256k1_scalar msg, key;
        testutil_random_scalar_order_test(&msg);
        testutil_random_scalar_order_test(&key);
        secp256k1_scalar_get_b32(privkey, &key);
        secp256k1_scalar_get_b32(message, &msg);
    }

    /* Construct and verify corresponding public key. */
    CHECK(secp256k1_ec_seckey_verify(CTX, privkey) == 1);
    CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, privkey) == 1);

    /* Verify exporting and importing public key. */
    CHECK(secp256k1_ec_pubkey_serialize(CTX, pubkeyc, &pubkeyclen, &pubkey, testrand_bits(1) == 1 ? SECP256K1_EC_COMPRESSED : SECP256K1_EC_UNCOMPRESSED));
    memset(&pubkey, 0, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkey, pubkeyc, pubkeyclen) == 1);

    /* Verify negation changes the key and changes it back */
    memcpy(&pubkey_tmp, &pubkey, sizeof(pubkey));
    CHECK(secp256k1_ec_pubkey_negate(CTX, &pubkey_tmp) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey_tmp, &pubkey, sizeof(pubkey)) != 0);
    CHECK(secp256k1_ec_pubkey_negate(CTX, &pubkey_tmp) == 1);
    CHECK(secp256k1_memcmp_var(&pubkey_tmp, &pubkey, sizeof(pubkey)) == 0);

    /* Verify private key import and export. */
    CHECK(ec_privkey_export_der(CTX, seckey, &seckeylen, privkey, testrand_bits(1) == 1));
    CHECK(ec_privkey_import_der(CTX, privkey2, seckey, seckeylen) == 1);
    CHECK(secp256k1_memcmp_var(privkey, privkey2, 32) == 0);

    /* Optionally tweak the keys using addition. */
    if (testrand_int(3) == 0) {
        int ret1;
        int ret2;
        unsigned char rnd[32];
        secp256k1_pubkey pubkey2;
        testrand256_test(rnd);
        ret1 = secp256k1_ec_seckey_tweak_add(CTX, privkey, rnd);
        ret2 = secp256k1_ec_pubkey_tweak_add(CTX, &pubkey, rnd);
        CHECK(ret1 == ret2);
        if (ret1 == 0) {
            return;
        }
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey2, privkey) == 1);
        CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    }

    /* Optionally tweak the keys using multiplication. */
    if (testrand_int(3) == 0) {
        int ret1;
        int ret2;
        unsigned char rnd[32];
        secp256k1_pubkey pubkey2;
        testrand256_test(rnd);
        ret1 = secp256k1_ec_seckey_tweak_mul(CTX, privkey, rnd);
        ret2 = secp256k1_ec_pubkey_tweak_mul(CTX, &pubkey, rnd);
        CHECK(ret1 == ret2);
        if (ret1 == 0) {
            return;
        }
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey2, privkey) == 1);
        CHECK(secp256k1_memcmp_var(&pubkey, &pubkey2, sizeof(pubkey)) == 0);
    }

    /* Sign. */
    CHECK(secp256k1_ecdsa_sign(CTX, &signature[0], message, privkey, NULL, NULL) == 1);
    CHECK(secp256k1_ecdsa_sign(CTX, &signature[4], message, privkey, NULL, NULL) == 1);
    CHECK(secp256k1_ecdsa_sign(CTX, &signature[1], message, privkey, NULL, extra) == 1);
    extra[31] = 1;
    CHECK(secp256k1_ecdsa_sign(CTX, &signature[2], message, privkey, NULL, extra) == 1);
    extra[31] = 0;
    extra[0] = 1;
    CHECK(secp256k1_ecdsa_sign(CTX, &signature[3], message, privkey, NULL, extra) == 1);
    CHECK(secp256k1_memcmp_var(&signature[0], &signature[4], sizeof(signature[0])) == 0);
    CHECK(secp256k1_memcmp_var(&signature[0], &signature[1], sizeof(signature[0])) != 0);
    CHECK(secp256k1_memcmp_var(&signature[0], &signature[2], sizeof(signature[0])) != 0);
    CHECK(secp256k1_memcmp_var(&signature[0], &signature[3], sizeof(signature[0])) != 0);
    CHECK(secp256k1_memcmp_var(&signature[1], &signature[2], sizeof(signature[0])) != 0);
    CHECK(secp256k1_memcmp_var(&signature[1], &signature[3], sizeof(signature[0])) != 0);
    CHECK(secp256k1_memcmp_var(&signature[2], &signature[3], sizeof(signature[0])) != 0);
    /* Verify. */
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 1);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[1], message, &pubkey) == 1);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[2], message, &pubkey) == 1);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[3], message, &pubkey) == 1);
    /* Test lower-S form, malleate, verify and fail, test again, malleate again */
    CHECK(!secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[0]));
    secp256k1_ecdsa_signature_load(CTX, &r, &s, &signature[0]);
    secp256k1_scalar_negate(&s, &s);
    secp256k1_ecdsa_signature_save(&signature[5], &r, &s);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 0);
    CHECK(secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5]));
    CHECK(secp256k1_ecdsa_signature_normalize(CTX, &signature[5], &signature[5]));
    CHECK(!secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5]));
    CHECK(!secp256k1_ecdsa_signature_normalize(CTX, &signature[5], &signature[5]));
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 1);
    secp256k1_scalar_negate(&s, &s);
    secp256k1_ecdsa_signature_save(&signature[5], &r, &s);
    CHECK(!secp256k1_ecdsa_signature_normalize(CTX, NULL, &signature[5]));
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[5], message, &pubkey) == 1);
    CHECK(secp256k1_memcmp_var(&signature[5], &signature[0], 64) == 0);

    /* Serialize/parse DER and verify again */
    CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, sig, &siglen, &signature[0]) == 1);
    memset(&signature[0], 0, sizeof(signature[0]));
    CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &signature[0], sig, siglen) == 1);
    CHECK(secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 1);
    /* Serialize/destroy/parse DER and verify again. */
    siglen = 74;
    CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, sig, &siglen, &signature[0]) == 1);
    sig[testrand_int(siglen)] += 1 + testrand_int(255);
    CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &signature[0], sig, siglen) == 0 ||
          secp256k1_ecdsa_verify(CTX, &signature[0], message, &pubkey) == 0);
}